

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getShadowSamplingFunctionCall
          (TextureCubeMapArraySamplingTest *this,samplingFunction sampling_function,
          GLchar *color_type,GLuint n_components,GLchar *attribute_name_prefix,
          GLchar *attribute_index,GLchar *color_variable_name,GLchar *color_variable_index,
          GLchar *sampler_name_p,string *out_code)

{
  ostream *poVar1;
  ostream *poVar2;
  NotSupportedError *this_00;
  GLuint i;
  long lVar3;
  char *pcVar4;
  var2str local_208;
  var2str local_1e8;
  var2str local_1d0;
  stringstream stream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  switch(sampling_function) {
  case Texture:
    poVar2 = std::operator<<(&local_1a8,"    ");
    local_208.m_prefix = (GLchar *)0x0;
    local_208.m_name = color_variable_name;
    local_208.m_index = color_variable_index;
    glcts::operator<<(poVar2,&local_208);
    poVar2 = std::operator<<(&local_1a8," = ");
    poVar2 = std::operator<<(poVar2,"texture");
    poVar2 = std::operator<<(poVar2,"(");
    std::operator<<(poVar2,sampler_name_p);
    poVar2 = std::operator<<(&local_1a8,", ");
    local_208.m_name = "texture_coordinates";
    local_208.m_prefix = attribute_name_prefix;
    local_208.m_index = attribute_index;
    glcts::operator<<(poVar2,&local_208);
    poVar2 = std::operator<<(poVar2,", ");
    local_1e8.m_name = "refZ";
    local_1e8.m_prefix = attribute_name_prefix;
    local_1e8.m_index = attribute_index;
    glcts::operator<<(poVar2,&local_1e8);
    break;
  case TextureLod:
    poVar2 = std::operator<<(&local_1a8,"    ");
    local_208.m_prefix = (GLchar *)0x0;
    local_208.m_name = color_variable_name;
    local_208.m_index = color_variable_index;
    glcts::operator<<(poVar2,&local_208);
    poVar2 = std::operator<<(&local_1a8," = ");
    poVar2 = std::operator<<(poVar2,"textureLod");
    poVar2 = std::operator<<(poVar2,"(");
    std::operator<<(poVar2,sampler_name_p);
    poVar2 = std::operator<<(&local_1a8,", ");
    local_208.m_name = "texture_coordinates";
    local_208.m_prefix = attribute_name_prefix;
    local_208.m_index = attribute_index;
    glcts::operator<<(poVar2,&local_208);
    poVar2 = std::operator<<(poVar2,", ");
    local_1e8.m_name = "lod";
    local_1e8.m_prefix = attribute_name_prefix;
    local_1e8.m_index = attribute_index;
    glcts::operator<<(poVar2,&local_1e8);
    poVar2 = std::operator<<(poVar2,", ");
    local_1d0.m_name = "refZ";
    local_1d0.m_prefix = attribute_name_prefix;
    local_1d0.m_index = attribute_index;
    glcts::operator<<(poVar2,&local_1d0);
    break;
  case TextureGrad:
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"textureGrad operation is not available for samplerCubeArrayShadow",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
               ,0xbfe);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  case TextureGather:
    poVar2 = &local_1a8;
    if (n_components == 4) {
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        poVar1 = std::operator<<(poVar2,"    ");
        poVar1 = std::operator<<(poVar1,color_type);
        poVar1 = std::operator<<(poVar1,"component_");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar2," = ");
        poVar1 = std::operator<<(poVar1,"textureGather");
        poVar1 = std::operator<<(poVar1,"(");
        std::operator<<(poVar1,sampler_name_p);
        poVar1 = std::operator<<(poVar2,", ");
        local_208.m_name = "texture_coordinates";
        local_208.m_prefix = attribute_name_prefix;
        local_208.m_index = attribute_index;
        glcts::operator<<(poVar1,&local_208);
        poVar1 = std::operator<<(poVar1,", ");
        local_1e8.m_name = "refZ";
        local_1e8.m_prefix = attribute_name_prefix;
        local_1e8.m_index = attribute_index;
        glcts::operator<<(poVar1,&local_1e8);
        poVar1 = std::operator<<(poVar2,");");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      poVar1 = std::operator<<(poVar2,"    ");
      local_208.m_prefix = (GLchar *)0x0;
      local_208.m_name = color_variable_name;
      local_208.m_index = color_variable_index;
      glcts::operator<<(poVar1,&local_208);
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,color_type);
      poVar2 = std::operator<<(poVar2,"(component_0.r, ");
      poVar2 = std::operator<<(poVar2,"component_1.g, ");
      poVar2 = std::operator<<(poVar2,"component_2.b, ");
      pcVar4 = "component_3.a);";
    }
    else {
      poVar1 = std::operator<<(poVar2,"    ");
      local_208.m_prefix = (GLchar *)0x0;
      local_208.m_name = color_variable_name;
      local_208.m_index = color_variable_index;
      glcts::operator<<(poVar1,&local_208);
      poVar1 = std::operator<<(poVar2," = ");
      poVar1 = std::operator<<(poVar1,"textureGather");
      poVar1 = std::operator<<(poVar1,"(");
      std::operator<<(poVar1,sampler_name_p);
      poVar1 = std::operator<<(poVar2,", ");
      local_208.m_name = "texture_coordinates";
      local_208.m_prefix = attribute_name_prefix;
      local_208.m_index = attribute_index;
      glcts::operator<<(poVar1,&local_208);
      poVar1 = std::operator<<(poVar1,", ");
      local_1e8.m_name = "refZ";
      local_1e8.m_prefix = attribute_name_prefix;
      local_1e8.m_index = attribute_index;
      glcts::operator<<(poVar1,&local_1e8);
      pcVar4 = ").x;";
    }
    goto LAB_00d4400d;
  default:
    goto switchD_00d43b71_default;
  }
  poVar2 = &local_1a8;
  pcVar4 = ");";
LAB_00d4400d:
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
switchD_00d43b71_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_code,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getShadowSamplingFunctionCall(
	samplingFunction sampling_function, const glw::GLchar* color_type, glw::GLuint n_components,
	const glw::GLchar* attribute_name_prefix, const glw::GLchar* attribute_index,
	const glw::GLchar* color_variable_name, const glw::GLchar* color_variable_index, const glw::GLchar* sampler_name_p,
	std::string& out_code)
{
	std::stringstream stream;

	switch (sampling_function)
	{
	case Texture:
		/* fs_in_color = texture(sampler, vs_out_texture_coordinates); */
		stream << "    " << var2str(0, color_variable_name, color_variable_index);

		stream << " = " << texture_func << "(" << sampler_name_p;

		stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

		stream << ");" << std::endl;
		break;
	case TextureLod:
		/* fs_in_color = textureLod(sampler, vs_out_texture_coordinates, lod); */
		stream << "    " << var2str(0, color_variable_name, color_variable_index);

		stream << " = " << textureLod_func << "(" << sampler_name_p;

		stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_lod, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

		stream << ");" << std::endl;
		break;
	case TextureGrad:
		/* fs_in_color = textureGrad(sampler, vs_out_texture_coordinates, vs_out_grad_x, vs_out_grad_y); */
		throw tcu::NotSupportedError("textureGrad operation is not available for samplerCubeArrayShadow", "", __FILE__,
									 __LINE__);
		break;
	case TextureGather:
		if (4 == n_components)
		{
			/**
			 *  color_type component_0 = textureGather(sampler, vs_out_texture_coordinates, 0);
			 *  color_type component_1 = textureGather(sampler, vs_out_texture_coordinates, 1);
			 *  color_type component_2 = textureGather(sampler, vs_out_texture_coordinates, 2);
			 *  color_type component_3 = textureGather(sampler, vs_out_texture_coordinates, 3);
			 *  fs_in_color = color_type(component_0.r, component_1.g, component_2.b, component_3.a);
			 **/
			for (glw::GLuint i = 0; i < 4; ++i)
			{
				stream << "    " << color_type << "component_" << i;

				stream << " = " << textureGather_func << "(" << sampler_name_p;

				stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
					   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

				stream << ");" << std::endl;
			}

			stream << "    " << var2str(0, color_variable_name, color_variable_index);

			stream << " = " << color_type << "(component_0.r, "
				   << "component_1.g, "
				   << "component_2.b, "
				   << "component_3.a);" << std::endl;
		}
		else
		{
			stream << "    " << var2str(0, color_variable_name, color_variable_index);

			stream << " = " << textureGather_func << "(" << sampler_name_p;

			stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
				   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

			stream << ").x;" << std::endl;
		}
		break;
	}

	out_code = stream.str();
}